

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_pyr.h
# Opt level: O0

Image<unsigned_short> * __thiscall
vo::ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_>::lvl_internal
          (Image<unsigned_short> *__return_storage_ptr__,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *this,size_t lvl)

{
  byte bVar1;
  size_t local_60;
  size_t local_58;
  size_t height;
  size_t width;
  size_t y;
  size_t x;
  size_t lvl_local;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *this_local;
  
  if (lvl == 0) {
    local_58 = 0;
  }
  else {
    local_58 = this->orig_w;
  }
  bVar1 = (byte)lvl;
  if (lvl < 2) {
    local_60 = 0;
  }
  else {
    local_60 = (this->image).super_Image<unsigned_short>.h -
               ((this->image).super_Image<unsigned_short>.h >> (bVar1 - 1 & 0x3f));
  }
  Image<unsigned_short>::SubImage
            (__return_storage_ptr__,&(this->image).super_Image<unsigned_short>,local_58,local_60,
             this->orig_w >> (bVar1 & 0x3f),
             (this->image).super_Image<unsigned_short>.h >> (bVar1 & 0x3f));
  return __return_storage_ptr__;
}

Assistant:

inline Image<T> lvl_internal(size_t lvl) {
    size_t x = (lvl == 0) ? 0 : orig_w;
    size_t y = (lvl <= 1) ? 0 : (image.h - (image.h >> (lvl - 1)));
    size_t width = (orig_w >> lvl);
    size_t height = (image.h >> lvl);

    return image.SubImage(x, y, width, height);
  }